

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::ReflectionClassGenerator
          (ReflectionClassGenerator *this,FileDescriptor *file,Options *options)

{
  FileDescriptor *descriptor;
  FileDescriptor *descriptor_00;
  FileDescriptor *descriptor_01;
  string local_50;
  
  SourceGeneratorBase::SourceGeneratorBase(&this->super_SourceGeneratorBase,options);
  (this->super_SourceGeneratorBase)._vptr_SourceGeneratorBase =
       (_func_int **)&PTR__ReflectionClassGenerator_00793908;
  this->file_ = file;
  (this->namespace_)._M_dataplus._M_p = (pointer)&(this->namespace_).field_2;
  (this->namespace_)._M_string_length = 0;
  (this->namespace_).field_2._M_local_buf[0] = '\0';
  (this->reflectionClassname_)._M_dataplus._M_p = (pointer)&(this->reflectionClassname_).field_2;
  (this->reflectionClassname_)._M_string_length = 0;
  (this->reflectionClassname_).field_2._M_local_buf[0] = '\0';
  (this->extensionClassname_)._M_dataplus._M_p = (pointer)&(this->extensionClassname_).field_2;
  (this->extensionClassname_)._M_string_length = 0;
  (this->extensionClassname_).field_2._M_local_buf[0] = '\0';
  GetFileNamespace_abi_cxx11_(&local_50,(csharp *)file,descriptor);
  std::__cxx11::string::operator=((string *)&this->namespace_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  GetReflectionClassUnqualifiedName_abi_cxx11_(&local_50,(csharp *)file,descriptor_00);
  std::__cxx11::string::operator=((string *)&this->reflectionClassname_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  GetExtensionClassUnqualifiedName_abi_cxx11_(&local_50,(csharp *)file,descriptor_01);
  std::__cxx11::string::operator=((string *)&this->extensionClassname_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

ReflectionClassGenerator::ReflectionClassGenerator(const FileDescriptor* file,
                                                   const Options* options)
    : SourceGeneratorBase(options),
      file_(file) {
  namespace_ = GetFileNamespace(file);
  reflectionClassname_ = GetReflectionClassUnqualifiedName(file);
  extensionClassname_ = GetExtensionClassUnqualifiedName(file);
}